

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O3

void __thiscall
MuxerManager::checkTrackList(MuxerManager *this,vector<StreamInfo,_std::allocator<StreamInfo>_> *ci)

{
  pointer pSVar1;
  size_type sVar2;
  byte bVar3;
  byte bVar4;
  size_type __n;
  size_type __n_00;
  size_type __n_01;
  size_type __n_02;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  bool bVar9;
  char *pcVar10;
  StreamInfo *si;
  pointer pSVar11;
  ostringstream ss;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  MuxerManager *local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  pointer local_1b8;
  pointer local_1b0;
  ostringstream local_1a8 [376];
  
  __n_02 = ::mlpCodecInfo.programName._M_string_length;
  __n_01 = ::aacCodecInfo.programName._M_string_length;
  __n_00 = ::h264DepCodecInfo.programName._M_string_length;
  __n = ::h264CodecInfo.programName._M_string_length;
  if (this->m_demuxMode != false) {
    return;
  }
  pSVar11 = (ci->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (ci->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar11 == pSVar1) {
    bVar9 = true;
    if (this->m_bluRayMode == false) {
      return;
    }
LAB_001bf53a:
    if ((V3_flags & 0x44U) != 4) goto LAB_001bf578;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will not play in a Blu-ray player."
               ,0x7b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    local_1b0 = ::h264CodecInfo.programName._M_dataplus._M_p;
    local_1b8 = ::h264DepCodecInfo.programName._M_dataplus._M_p;
    local_1c0 = ::aacCodecInfo.programName._M_dataplus._M_p;
    local_1c8 = ::mlpCodecInfo.programName._M_dataplus._M_p;
    bVar4 = 0;
    bVar3 = 0;
    bVar5 = false;
    bVar6 = false;
    local_1d0 = this;
    do {
      sVar2 = (pSVar11->m_codec)._M_string_length;
      if ((sVar2 == __n) &&
         ((__n == 0 || (iVar7 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1b0,__n), iVar7 == 0)
          ))) {
        bVar4 = 1;
      }
      else if ((sVar2 == __n_00) &&
              ((__n_00 == 0 ||
               (iVar7 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1b8,__n_00), iVar7 == 0)))) {
        bVar3 = 1;
      }
      else if ((sVar2 == __n_01) &&
              ((__n_01 == 0 ||
               (iVar7 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1c0,__n_01), iVar7 == 0)))) {
        bVar6 = true;
      }
      else if ((sVar2 == __n_02) &&
              ((__n_02 == 0 ||
               (iVar7 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1c8,__n_02), iVar7 == 0)))) {
        bVar5 = true;
      }
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar1);
    bVar9 = (bool)(bVar4 | bVar3 ^ 1);
    if (local_1d0->m_bluRayMode == false) goto LAB_001bf578;
    if (bVar6) {
      pcVar10 = 
      "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player."
      ;
    }
    else {
      if (!bVar5) goto LAB_001bf53a;
      pcVar10 = 
      "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player."
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,0x5c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  sLastMsg = true;
LAB_001bf578:
  if (bVar9) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "Fatal error: MVC depended view track can\'t be muxed without AVC base view track",0x4f
            );
  puVar8 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar8 = 0x1f8;
  *(undefined4 **)(puVar8 + 2) = puVar8 + 6;
  if (local_1f0 == &local_1e0) {
    puVar8[6] = local_1e0;
    puVar8[7] = uStack_1dc;
    puVar8[8] = uStack_1d8;
    puVar8[9] = uStack_1d4;
  }
  else {
    *(uint **)(puVar8 + 2) = local_1f0;
    *(ulong *)(puVar8 + 6) = CONCAT44(uStack_1dc,local_1e0);
  }
  *(undefined8 *)(puVar8 + 4) = local_1e8;
  local_1e0 = local_1e0 & 0xffffff00;
  __cxa_throw(puVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void MuxerManager::checkTrackList(const vector<StreamInfo>& ci) const
{
    if (m_demuxMode)
        return;

    bool avcFound = false;
    bool mvcFound = false;
    bool aacFound = false;
    bool mlpFound = false;

    for (const StreamInfo& si : ci)
    {
        if (si.m_codec == h264CodecInfo.programName)
            avcFound = true;
        else if (si.m_codec == h264DepCodecInfo.programName)
            mvcFound = true;
        else if (si.m_codec == aacCodecInfo.programName)
            aacFound = true;
        else if (si.m_codec == mlpCodecInfo.programName)
            mlpFound = true;
    }

    if (m_bluRayMode)
    {
        if (aacFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && mlpFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && (V3_flags & DV) && !(V3_flags & BL_TRACK))
            LTRACE(LT_ERROR, 2,
                   "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will "
                   "not play in a Blu-ray player.");
    }
    if (!avcFound && mvcFound)
        THROW(ERR_INVALID_STREAMS_SELECTED,
              "Fatal error: MVC depended view track can't be muxed without AVC base view track")
}